

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char cVar2;
  byte *pbVar3;
  size_t sVar4;
  Ch *pCVar5;
  bool bVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  undefined4 uVar10;
  ulong uVar11;
  Ch c;
  int iVar12;
  byte *pbVar13;
  byte bVar14;
  int iVar15;
  ulong i;
  Ch c_5;
  uint uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double d;
  ulong local_68;
  
  pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
  cVar1 = *is->current_;
  if (cVar1 == '-') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  }
  bVar8 = *is->current_;
  if (bVar8 == 0x30) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    iVar15 = 0;
    bVar9 = false;
    uVar16 = 0;
    local_68 = 0;
  }
  else {
    if (8 < (byte)(bVar8 - 0x31)) {
      pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      uVar10 = 3;
      goto LAB_00114d04;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    local_68 = (ulong)(bVar8 - 0x30);
    bVar8 = *is->current_;
    if (cVar1 == '-') {
      if ((byte)(bVar8 - 0x30) < 10) {
        iVar15 = 0;
        do {
          uVar16 = (uint)local_68;
          if ((0xccccccb < uVar16) && ('8' < (char)bVar8 || uVar16 != 0xccccccc)) goto LAB_0011474f;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          local_68 = (ulong)((uVar16 * 10 + (uint)bVar8) - 0x30);
          iVar15 = iVar15 + 1;
          bVar8 = *is->current_;
        } while ((byte)(bVar8 - 0x30) < 10);
      }
      else {
LAB_00114d93:
        iVar15 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar8 - 0x30)) goto LAB_00114d93;
      iVar15 = 0;
      do {
        uVar16 = (uint)local_68;
        if ((0x19999998 < uVar16) && ('5' < (char)bVar8 || uVar16 != 0x19999999)) goto LAB_0011474f;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        local_68 = (ulong)((uVar16 * 10 + (uint)bVar8) - 0x30);
        iVar15 = iVar15 + 1;
        bVar8 = *is->current_;
      } while ((byte)(bVar8 - 0x30) < 10);
    }
    bVar9 = false;
    uVar16 = 0;
  }
LAB_00114766:
  i = (ulong)uVar16;
  dVar21 = 0.0;
  if (bVar9) {
    uVar11 = (ulong)(byte)*is->current_;
    bVar8 = *is->current_ - 0x30;
    if (cVar1 == '-') {
      if (9 < bVar8) goto LAB_0011486c;
      do {
        if ((0xccccccccccccccb < i) && (i != 0xccccccccccccccc || '8' < (char)uVar11))
        goto LAB_00114841;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        i = (uVar11 & 0xf) + i * 10;
        iVar15 = iVar15 + 1;
        uVar11 = (ulong)(byte)*is->current_;
      } while ((byte)(*is->current_ - 0x30U) < 10);
    }
    else {
      if (9 < bVar8) goto LAB_0011486c;
      do {
        if ((0x1999999999999998 < i) && (i != 0x1999999999999999 || '5' < (char)uVar11))
        goto LAB_00114841;
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        i = (uVar11 & 0xf) + i * 10;
        iVar15 = iVar15 + 1;
        uVar11 = (ulong)(byte)*is->current_;
      } while ((byte)(*is->current_ - 0x30U) < 10);
    }
    bVar6 = false;
    dVar21 = 0.0;
  }
  else {
LAB_0011486c:
    bVar6 = false;
  }
LAB_0011487d:
  if (bVar6) {
    bVar8 = *is->current_;
    while ((byte)(bVar8 - 0x30) < 10) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      dVar21 = dVar21 * 10.0 + (double)(int)(bVar8 - 0x30);
      bVar8 = *is->current_;
    }
  }
  if (*is->current_ == '.') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    if ((byte)(*is->current_ - 0x3aU) < 0xf6) {
      pbVar13 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      uVar10 = 0xe;
      goto LAB_00114d04;
    }
    iVar12 = 0;
    if (!bVar6) {
      if (!bVar9) {
        i = local_68;
      }
      bVar8 = *is->current_;
      iVar12 = 0;
      if ((0xf5 < (byte)(bVar8 - 0x3a)) && (i < 0x20000000000000)) {
        iVar12 = 0;
        do {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          iVar12 = iVar12 + -1;
          i = (ulong)(bVar8 & 0xf) + i * 10;
          iVar15 = (uint)(i != 0) + iVar15;
          bVar8 = *is->current_;
          if ((byte)(bVar8 - 0x3a) < 0xf6) break;
        } while (i < 0x20000000000000);
      }
      auVar19._8_4_ = (int)(i >> 0x20);
      auVar19._0_8_ = i;
      auVar19._12_4_ = 0x45300000;
      dVar21 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar6 = true;
    }
    bVar8 = *is->current_;
    while ((byte)(bVar8 - 0x30) < 10) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      if (iVar15 < 0x11) {
        dVar21 = dVar21 * 10.0 + (double)(int)(bVar8 - 0x30);
        iVar12 = iVar12 + -1;
        if (0.0 < dVar21) {
          iVar15 = iVar15 + 1;
        }
      }
      bVar8 = *is->current_;
    }
  }
  else {
    iVar12 = 0;
  }
  if ((*is->current_ == 'e') || (*is->current_ == 'E')) {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    uVar11 = local_68;
    if (bVar9) {
      uVar11 = i;
    }
    if (!bVar6) {
      auVar20._8_4_ = (int)(uVar11 >> 0x20);
      auVar20._0_8_ = uVar11;
      auVar20._12_4_ = 0x45300000;
      dVar21 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      bVar6 = true;
    }
    if (*is->current_ == '+') {
      bVar17 = false;
LAB_00114a85:
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    }
    else {
      bVar17 = *is->current_ == '-';
      if (bVar17) goto LAB_00114a85;
    }
    pbVar3 = (byte *)is->current_;
    bVar8 = *pbVar3;
    if ((byte)(bVar8 - 0x30) < 10) {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      iVar15 = bVar8 - 0x30;
      if (bVar17) {
        bVar8 = *is->current_;
        while ((byte)(bVar8 - 0x30) < 10) {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          iVar15 = iVar15 * 10 + (uint)bVar8 + -0x30;
          if ((iVar12 + 0x7ffffff7) / 10 < iVar15) {
            cVar2 = *is->current_;
            while ((byte)(cVar2 - 0x30U) < 10) {
              BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
              cVar2 = *is->current_;
            }
          }
          bVar8 = *is->current_;
        }
      }
      else {
        do {
          bVar8 = *is->current_;
          bVar14 = bVar8 - 0x30;
          if (9 < bVar14) goto LAB_00114b31;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          iVar15 = iVar15 * 10 + (uint)bVar8 + -0x30;
        } while (iVar15 <= 0x134 - iVar12);
        *(undefined4 *)(this + 0x30) = 0xd;
        *(byte **)(this + 0x38) = pbVar13;
LAB_00114b31:
        if (bVar14 < 10) {
          bVar17 = false;
          goto LAB_00114bab;
        }
      }
      iVar7 = -iVar15;
      if (!bVar17) {
        iVar7 = iVar15;
      }
      iVar15 = iVar7;
      bVar17 = true;
    }
    else {
      sVar4 = is->count_;
      pCVar5 = is->buffer_;
      *(undefined4 *)(this + 0x30) = 0xf;
      *(byte **)(this + 0x38) = pbVar3 + (sVar4 - (long)pCVar5);
      bVar17 = false;
      iVar15 = 0;
    }
LAB_00114bab:
    if (!bVar17) {
      return;
    }
  }
  else {
    iVar15 = 0;
  }
  if (bVar6) {
    uVar16 = iVar15 + iVar12;
    if ((int)uVar16 < -0x134) {
      d = 0.0;
      if (-0x269 < (int)uVar16) {
        d = (dVar21 / 1e+308) / *(double *)(internal::Pow10(int)::e + (ulong)(-uVar16 - 0x134) * 8);
      }
    }
    else if ((int)uVar16 < 0) {
      d = dVar21 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar16 * 8);
    }
    else {
      d = dVar21 * *(double *)(internal::Pow10(int)::e + (ulong)uVar16 * 8);
    }
    if (d <= 1.79769313486232e+308) {
      if (cVar1 == '-') {
        d = -d;
      }
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Double(handler,d);
      goto LAB_00114cc9;
    }
    *(undefined4 *)(this + 0x30) = 0xd;
    *(byte **)(this + 0x38) = pbVar13;
    bVar6 = true;
    bVar9 = true;
  }
  else {
    if (bVar9) {
      if (cVar1 == '-') {
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-i);
      }
      else {
        bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Uint64(handler,i);
      }
    }
    else if (cVar1 == '-') {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Int(handler,-(uint)local_68);
    }
    else {
      bVar9 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
              ::Uint(handler,(uint)local_68);
    }
LAB_00114cc9:
    bVar6 = false;
  }
  if (bVar6) {
    return;
  }
  if (bVar9 != false) {
    return;
  }
  uVar10 = 0x10;
LAB_00114d04:
  *(undefined4 *)(this + 0x30) = uVar10;
  *(byte **)(this + 0x38) = pbVar13;
  return;
LAB_0011474f:
  uVar16 = (uint)local_68;
  bVar9 = true;
  goto LAB_00114766;
LAB_00114841:
  auVar18._8_4_ = (int)(i >> 0x20);
  auVar18._0_8_ = i;
  auVar18._12_4_ = 0x45300000;
  dVar21 = (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  bVar6 = true;
  goto LAB_0011487d;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        typedef typename internal::SelectIf<internal::BoolType<(parseFlags & kParseNumbersAsStringsFlag) != 0>, typename TargetEncoding::Ch, char>::Type NumberCharacter;

        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, NumberCharacter,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }

            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (!useNanOrInf && Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (!useNanOrInf && (Consume(s, 'e') || Consume(s, 'E'))) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                GenericStringStream<UTF8<NumberCharacter> > srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<typename TargetEncoding::Ch>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const NumberCharacter* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > (std::numeric_limits<double>::max)()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }